

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

void extras(bool help,bool version,PatternList *options)

{
  undefined8 uVar1;
  string *in_RDX;
  byte in_SIL;
  byte in_DIL;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  string *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  string *opt1;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  byte bVar2;
  bool local_bc;
  allocator local_b9;
  string local_b8 [37];
  byte local_93;
  byte local_92;
  undefined1 local_91 [38];
  byte local_6b;
  byte local_6a;
  allocator local_69;
  string local_68 [35];
  byte local_45;
  byte local_32;
  allocator local_31;
  string local_30 [32];
  string *local_10;
  byte local_2;
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_2 = in_SIL & 1;
  local_32 = 0;
  local_45 = 0;
  local_6a = 0;
  local_6b = 0;
  local_bc = false;
  local_10 = in_RDX;
  if (local_1 != 0) {
    std::allocator<char>::allocator();
    local_32 = 1;
    std::__cxx11::string::string(local_30,"-h",&local_31);
    local_45 = 1;
    std::allocator<char>::allocator();
    local_6a = 1;
    std::__cxx11::string::string(local_68,"--help",&local_69);
    local_6b = 1;
    local_bc = isOptionSet((PatternList *)
                           CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  }
  if ((local_6b & 1) != 0) {
    std::__cxx11::string::~string(local_68);
  }
  if ((local_6a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  if ((local_45 & 1) != 0) {
    std::__cxx11::string::~string(local_30);
  }
  if ((local_32 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  if (local_bc == false) {
    local_92 = 0;
    local_93 = 0;
    bVar2 = 0;
    if ((local_2 & 1) != 0) {
      opt1 = (string *)local_91;
      std::allocator<char>::allocator();
      local_92 = 1;
      std::__cxx11::string::string((string *)(local_91 + 1),"--version",(allocator *)opt1);
      local_93 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"",&local_b9);
      bVar2 = isOptionSet((PatternList *)CONCAT17(bVar2,in_stack_ffffffffffffff10),opt1,local_10);
      in_stack_fffffffffffffef7 = bVar2;
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    if ((local_93 & 1) != 0) {
      std::__cxx11::string::~string((string *)(local_91 + 1));
    }
    if ((local_92 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_91);
    }
    if ((bVar2 & 1) == 0) {
      return;
    }
    uVar1 = __cxa_allocate_exception(0x10);
    docopt::DocoptExitVersion::DocoptExitVersion
              ((DocoptExitVersion *)
               CONCAT17(in_stack_fffffffffffffef7,CONCAT16(bVar2,in_stack_fffffffffffffef0)));
    __cxa_throw(uVar1,&docopt::DocoptExitVersion::typeinfo,
                docopt::DocoptExitVersion::~DocoptExitVersion);
  }
  uVar1 = __cxa_allocate_exception(0x10);
  docopt::DocoptExitHelp::DocoptExitHelp
            ((DocoptExitHelp *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
  __cxa_throw(uVar1,&docopt::DocoptExitHelp::typeinfo,docopt::DocoptExitHelp::~DocoptExitHelp);
}

Assistant:

static void extras(bool help, bool version, PatternList const& options) {
	if (help && isOptionSet(options, "-h", "--help")) {
		throw DocoptExitHelp();
	}

	if (version && isOptionSet(options, "--version")) {
		throw DocoptExitVersion();
	}
}